

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O1

void __thiscall HMISong::SetupForHMI(HMISong *this,int len)

{
  int iVar1;
  int iVar2;
  BYTE *pBVar3;
  TrackInfo *pTVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  
  this->ReadVarLen = ReadVarLenHMI;
  pBVar3 = this->MusHeader;
  uVar10 = (int)(short)((ushort)pBVar3[0xe5] << 8) | (uint)pBVar3[0xe4];
  this->NumTracks = uVar10;
  if (0 < (short)uVar10) {
    (this->super_MIDIStreamer).Division =
         ((int)(short)((ushort)pBVar3[0xd5] << 8) | (uint)pBVar3[0xd4]) << 2;
    (this->super_MIDIStreamer).InitialTempo = 4000000;
    pTVar4 = (TrackInfo *)operator_new__((ulong)(uVar10 * 0x38 + 0x38));
    this->Tracks = pTVar4;
    iVar1 = *(int *)(pBVar3 + 0xe8);
    uVar9 = 0;
    iVar5 = 0;
    do {
      iVar2 = *(int *)(pBVar3 + uVar9 * 4 + (long)iVar1);
      if ((iVar2 <= len + -0x9d) &&
         (lVar11 = (long)iVar2,
         *(long *)(pBVar3 + lVar11 + 5) == 0x4b43415254494449 &&
         *(long *)(pBVar3 + lVar11) == 0x4944494d2d494d48)) {
        iVar6 = len;
        if (uVar9 != uVar10 - 1) {
          iVar6 = *(int *)(pBVar3 + uVar9 * 4 + (long)iVar1 + 4);
        }
        iVar8 = len - iVar2;
        if (iVar6 - iVar2 < len - iVar2) {
          iVar8 = iVar6 - iVar2;
        }
        if (0 < iVar8) {
          iVar2 = *(int *)(pBVar3 + lVar11 + 0x57);
          if (iVar8 - iVar2 != 0 && iVar2 <= iVar8) {
            pTVar4[iVar5].TrackBegin = pBVar3 + iVar2 + lVar11;
            pTVar4[iVar5].TrackP = 0;
            pTVar4[iVar5].MaxTrackP = (ulong)(uint)(iVar8 - iVar2);
            lVar7 = 0;
            do {
              pTVar4[iVar5].Designation[lVar7] = *(WORD *)(pBVar3 + lVar7 * 2 + lVar11 + 0x99);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 8);
            iVar5 = iVar5 + 1;
          }
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar10);
    this->NumTracks = iVar5;
  }
  return;
}

Assistant:

void HMISong::SetupForHMI(int len)
{
	int i, p;

	ReadVarLen = ReadVarLenHMI;
	NumTracks = GetShort(MusHeader + HMI_TRACK_COUNT_OFFSET);

	if (NumTracks <= 0)
	{
		return;
	}

	// The division is the number of pulses per quarter note (PPQN).
	// HMI files have two values here, a full value and a quarter value. Some games, 
	// notably Quarantines, have identical values for some reason, so it's safer to
	// use the quarter value and multiply it by four than to trust the full value.
	Division = GetShort(MusHeader + HMI_DIVISION_OFFSET) << 2;
	InitialTempo = 4000000;

	Tracks = new TrackInfo[NumTracks + 1];
	int track_dir = GetInt(MusHeader + HMI_TRACK_DIR_PTR_OFFSET);

	// Gather information about each track
	for (i = 0, p = 0; i < NumTracks; ++i)
	{
		int start = GetInt(MusHeader + track_dir + i*4);
		int tracklen, datastart;

		if (start > len - HMITRACK_DESIGNATION_OFFSET - 4)
		{ // Track is incomplete.
			continue;
		}

		// BTW, HMI does not actually check the track header.
		if (memcmp(MusHeader + start, TRACK_MAGIC, 13) != 0)
		{
			continue;
		}

		// The track ends where the next one begins. If this is the
		// last track, then it ends at the end of the file.
		if (i == NumTracks - 1)
		{
			tracklen = len - start;
		}
		else
		{
			tracklen = GetInt(MusHeader + track_dir + i*4 + 4) - start;
		}
		// Clamp incomplete tracks to the end of the file.
		tracklen = MIN(tracklen, len - start);
		if (tracklen <= 0)
		{
			continue;
		}

		// Offset to actual MIDI events.
		datastart = GetInt(MusHeader + start + HMITRACK_DATA_PTR_OFFSET);
		tracklen -= datastart;
		if (tracklen <= 0)
		{
			continue;
		}

		// Store track information
		Tracks[p].TrackBegin = MusHeader + start + datastart;
		Tracks[p].TrackP = 0;
		Tracks[p].MaxTrackP = tracklen;

		// Retrieve track designations. We can't check them yet, since we have not yet
		// connected to the MIDI device.
		for (int ii = 0; ii < NUM_HMI_DESIGNATIONS; ++ii)
		{
			Tracks[p].Designation[ii] = GetShort(MusHeader + start + HMITRACK_DESIGNATION_OFFSET + ii*2);
		}

		p++;
	}

	// In case there were fewer actual chunks in the file than the
	// header specified, update NumTracks with the current value of p.
	NumTracks = p;
}